

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_mul_merge_randomized_Test::TestBody(correctness_mul_merge_randomized_Test *this)

{
  AssertionResult gtest_ar_;
  big_integer b;
  big_integer a;
  size_t i;
  vector<big_integer,_std::allocator<big_integer>_> x;
  uint itn;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined2 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea2;
  undefined1 in_stack_fffffffffffffea3;
  int in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  big_integer *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  Type in_stack_fffffffffffffecc;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_128;
  vector<big_integer,_std::allocator<big_integer>_> *in_stack_fffffffffffffee8;
  vector<big_integer,_std::allocator<big_integer>_> *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  AssertionResult *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  long local_30;
  int local_c;
  
  for (local_c = 0; local_c != 10; local_c = local_c + 1) {
    std::vector<big_integer,_std::allocator<big_integer>_>::vector
              ((vector<big_integer,_std::allocator<big_integer>_> *)0x124525);
    for (local_30 = 0; local_30 != 1000; local_30 = local_30 + 1) {
      in_stack_fffffffffffffea4 = anon_unknown.dwarf_998c::myrand();
      big_integer::big_integer(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      std::vector<big_integer,_std::allocator<big_integer>_>::push_back
                ((vector<big_integer,_std::allocator<big_integer>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,
                          CONCAT13(in_stack_fffffffffffffea3,
                                   CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))),
                 (value_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      big_integer::~big_integer
                ((big_integer *)
                 CONCAT44(in_stack_fffffffffffffea4,
                          CONCAT13(in_stack_fffffffffffffea3,
                                   CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))));
    }
    std::vector<big_integer,_std::allocator<big_integer>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    anon_unknown.dwarf_998c::merge_all<big_integer>
              ((vector<big_integer,_std::allocator<big_integer>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector
              ((vector<big_integer,_std::allocator<big_integer>_> *)in_stack_fffffffffffffeb0);
    std::vector<big_integer,_std::allocator<big_integer>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    anon_unknown.dwarf_998c::merge_all<big_integer>
              ((vector<big_integer,_std::allocator<big_integer>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector
              ((vector<big_integer,_std::allocator<big_integer>_> *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea3 =
         operator==((big_integer *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                    in_stack_fffffffffffffeb0);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)
               CONCAT44(in_stack_fffffffffffffea4,
                        CONCAT13(in_stack_fffffffffffffea3,
                                 CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))),
               (bool)in_stack_fffffffffffffe9f);
    in_stack_fffffffffffffea2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!(bool)in_stack_fffffffffffffea2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffed0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffebc,&in_stack_fffffffffffffeb0->sign);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 CONCAT44(in_stack_fffffffffffffea4,
                          CONCAT13(in_stack_fffffffffffffea3,
                                   CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
      testing::Message::~Message((Message *)0x1247b3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12481f);
    big_integer::~big_integer
              ((big_integer *)
               CONCAT44(in_stack_fffffffffffffea4,
                        CONCAT13(in_stack_fffffffffffffea3,
                                 CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))));
    big_integer::~big_integer
              ((big_integer *)
               CONCAT44(in_stack_fffffffffffffea4,
                        CONCAT13(in_stack_fffffffffffffea3,
                                 CONCAT12(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0))));
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector
              ((vector<big_integer,_std::allocator<big_integer>_> *)in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

TEST(correctness, mul_merge_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<big_integer> x;
        for (size_t i = 0; i != number_of_multipliers; ++i)
            x.push_back(myrand());

        big_integer a = merge_all(x);
        big_integer b = merge_all(x);

        EXPECT_TRUE(a == b);
    }
}